

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RJson.h
# Opt level: O3

RValue * __thiscall RJson::RDocument::last(RValue *__return_storage_ptr__,RDocument *this)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar1;
  ValueIterator pGVar2;
  Value *pVVar3;
  
  if ((this->_doc).
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      .data_.f.flags == 4) {
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)this);
    pMVar1 = (this->_doc).allocator_;
    if (pMVar1 == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
      __assert_fail("allocator_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/j05070415[P]RJson/rapidjson/include/rapidjson/document.h"
                    ,0xadc,
                    "Allocator &rapidjson::GenericDocument<rapidjson::UTF8<>>::GetAllocator() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator]"
                   );
    }
    __return_storage_ptr__->_allocator = pMVar1;
    __return_storage_ptr__->_value = pGVar2 + -1;
    __return_storage_ptr__->_own = false;
  }
  else {
    puts("RDocument is not an array, can not last!");
    __return_storage_ptr__->_allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
    pVVar3 = (Value *)operator_new(0x10);
    __return_storage_ptr__->_value = pVVar3;
    __return_storage_ptr__->_own = true;
    (pVVar3->data_).n = (Number)0x0;
    (pVVar3->data_).s.str = (Ch *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

RValue last() {
        if (!_doc.IsArray()) {
            printf("RDocument is not an array, can not last!\n");
            return {};
        }

        auto iter = _doc.End()-1;
        return RValue(&(*iter), &_doc.GetAllocator());
    }